

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdb.h
# Opt level: O0

uint cdb_append(cdb *p,uint size)

{
  uint uVar1;
  uint prev_size;
  uint size_local;
  cdb *p_local;
  
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                  ,0x47,"unsigned int cdb_append(struct cdb *, unsigned int)");
  }
  cdb_grow(p,p->size + size);
  uVar1 = p->size;
  p->size = size + p->size;
  if (uVar1 < p->size) {
    return uVar1;
  }
  __assert_fail("p->size > prev_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/cdb.h"
                ,0x4b,"unsigned int cdb_append(struct cdb *, unsigned int)");
}

Assistant:

static inline unsigned cdb_append(struct cdb *p, unsigned size)
{
    unsigned prev_size;
    assert(size > 0);
    cdb_grow(p, p->size + size);
    prev_size = p->size;
    p->size += size;
    assert(p->size > prev_size);
    return prev_size;
}